

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Args.cpp
# Opt level: O3

bool idx2::OptVal(int NArgs,cstr *Args,cstr Opt,v3<idx2::t2<char,_int>_> *Val)

{
  byte in_AL;
  bool bVar1;
  int iVar2;
  size_t sVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  bool bVar7;
  anon_union_8_2_2df48d06_for_stref_0 local_40;
  undefined4 local_38;
  
  if (NArgs < 7) {
    bVar7 = false;
  }
  else {
    iVar2 = strncmp(Args[1],Opt,0x20);
    if (iVar2 == 0) {
      uVar5 = 6;
      bVar7 = true;
      lVar6 = 1;
    }
    else {
      uVar5 = 6;
      do {
        uVar4 = uVar5;
        if (uVar4 + (2 - (ulong)(NArgs - 5)) == 6) {
          bVar7 = uVar4 + 1 < (ulong)(uint)NArgs;
          in_AL = 6;
          goto LAB_0010a80d;
        }
        iVar2 = strncmp(Args[uVar4 - 4],Opt,0x20);
        uVar5 = uVar4 + 1;
      } while (iVar2 != 0);
      bVar7 = uVar5 < (uint)NArgs;
      lVar6 = uVar4 - 4;
    }
    (Val->field_0).field_0.X.First = *Args[lVar6 + 1];
    local_40 = (anon_union_8_2_2df48d06_for_stref_0)
               ((anon_union_8_2_2df48d06_for_stref_0 *)(Args + lVar6 + 2))->Ptr;
    sVar3 = strlen(local_40.Ptr);
    local_38 = (undefined4)sVar3;
    bVar1 = ToInt((stref *)&local_40,&(Val->field_0).E[0].Second);
    (Val->field_0).field_0.Y.First = *Args[lVar6 + 2];
    if (bVar1) {
      local_40 = (anon_union_8_2_2df48d06_for_stref_0)
                 ((anon_union_8_2_2df48d06_for_stref_0 *)(Args + lVar6 + 3))->Ptr;
      sVar3 = strlen(local_40.Ptr);
      local_38 = (undefined4)sVar3;
      bVar1 = ToInt((stref *)&local_40,&(Val->field_0).E[1].Second);
      (Val->field_0).field_0.Z.First = *Args[lVar6 + 4];
      if (bVar1) {
        local_40 = (anon_union_8_2_2df48d06_for_stref_0)
                   ((anon_union_8_2_2df48d06_for_stref_0 *)(Args + uVar5))->Ptr;
        sVar3 = strlen(local_40.Ptr);
        local_38 = (undefined4)sVar3;
        in_AL = ToInt((stref *)&local_40,&(Val->field_0).E[2].Second);
        goto LAB_0010a80d;
      }
    }
    else {
      (Val->field_0).field_0.Z.First = *Args[lVar6 + 4];
    }
    in_AL = 0;
  }
LAB_0010a80d:
  return (bool)(bVar7 & in_AL);
}

Assistant:

bool
OptVal(int NArgs, cstr* Args, cstr Opt, v3<t2<char, int>>* Val)
{
  for (int I = 1; I + 5 < NArgs; ++I)
  {
    if (strncmp(Args[I], Opt, 32) == 0)
    {
      bool Success = true;
      (*Val)[0].First = Args[I + 1][0];
      Success = Success && ToInt(Args[I + 2], &(*Val)[0].Second);
      (*Val)[1].First = Args[I + 2][0];
      Success = Success && ToInt(Args[I + 3], &(*Val)[1].Second);
      (*Val)[2].First = Args[I + 4][0];
      Success = Success && ToInt(Args[I + 5], &(*Val)[2].Second);
      return Success;
    }
  }

  return false;
}